

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

void __thiscall
v_hashmap<substring,_features_*>::put_after_get
          (v_hashmap<substring,_features_*> *this,substring *key,uint64_t hash,features **val)

{
  long lVar1;
  
  if (*(char *)(*(long *)(this + 0x18) + *(long *)(this + 0x38) * 0x28) == '\0') {
    lVar1 = *(long *)(this + 0x40);
    *(long *)(this + 0x40) = lVar1 + 1;
    if ((ulong)((*(long *)(this + 0x28) - *(long *)(this + 0x18)) / 0x28) <= lVar1 * 4 + 4U) {
      double_size(this);
      get(this,key,hash);
    }
  }
  put_after_get_nogrow(this,key,hash,val);
  return;
}

Assistant:

void put_after_get(const K& key, uint64_t hash, const V& val)
  {
    if (!dat[last_position].occupied)
    {
      num_occupants++;
      if (num_occupants * 4 >= base_size())  // grow when we're a quarter full
      {
        double_size();
        get(key, hash);  // probably should change last_position-- this is the lazy man's way to do it
      }
    }

    // now actually insert it
    put_after_get_nogrow(key, hash, val);
  }